

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O2

void __thiscall
YacclabTests::SaveAverageWithStepsResults
          (YacclabTests *this,string *os_name,string *dataset_name,bool rounded)

{
  long lVar1;
  long *plVar2;
  char cVar3;
  ostream *poVar4;
  StreamDemultiplexer *this_00;
  mapped_type *pmVar5;
  undefined8 uVar6;
  int step_number;
  StepType n_step;
  long lVar7;
  int c;
  long lVar8;
  double local_290;
  double local_288;
  string local_270;
  string local_250;
  ofstream os;
  undefined8 auStack_228 [2];
  uint auStack_218 [122];
  
  std::ofstream::ofstream(&os,(string *)os_name,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    this_00 = StreamDemultiplexer::operator<<
                        ((StreamDemultiplexer *)dmux::cout,
                         (char (*) [31])"Unable to save average results");
    local_270._M_dataplus._M_p._0_1_ = 10;
    StreamDemultiplexer::operator<<(this_00,(char *)&local_270);
  }
  else {
    poVar4 = std::operator<<((ostream *)&os,"#Algorithm");
    std::operator<<(poVar4,'\t');
    for (n_step = ALLOC_DEALLOC; n_step != ST_SIZE; n_step = n_step + FIRST_SCAN) {
      Step_abi_cxx11_(&local_270,n_step);
      poVar4 = std::operator<<((ostream *)&os,(string *)&local_270);
      std::operator<<(poVar4,'\t');
      std::__cxx11::string::~string((string *)&local_270);
    }
    poVar4 = std::operator<<((ostream *)&os,"Total");
    std::operator<<(poVar4,'\n');
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
             ::at(&this->average_ws_results_,dataset_name);
    uVar6 = 8;
    if (rounded) {
      uVar6 = 2;
    }
    for (lVar7 = 0; lVar7 < *(int *)&pmVar5->field_0x8; lVar7 = lVar7 + 1) {
      std::__cxx11::string::string
                ((string *)&local_250,
                 (string *)
                 ((this->mode_cfg_->ccl_average_ws_algorithms).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar7));
      DoubleEscapeUnderscore(&local_270,&local_250);
      poVar4 = std::operator<<((ostream *)&os,(string *)&local_270);
      std::operator<<(poVar4,'\t');
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
      local_288 = 0.0;
      for (lVar8 = 0; lVar8 < *(int *)&pmVar5->field_0xc; lVar8 = lVar8 + 1) {
        lVar1 = *(long *)&pmVar5->field_0x10;
        plVar2 = *(long **)&pmVar5->field_0x48;
        local_290 = *(double *)(*plVar2 * lVar7 + lVar1 + lVar8 * 8);
        *(uint *)((long)auStack_218 + *(long *)(_os + -0x18)) =
             *(uint *)((long)auStack_218 + *(long *)(_os + -0x18)) & 0xfffffefb | 4;
        if (rounded) {
          *(undefined8 *)((long)auStack_228 + *(long *)(_os + -0x18)) = 2;
          poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar1 + *plVar2 * lVar7 + lVar8 * 8))
          ;
          local_290 = floor(local_290 * 100.0 + 0.5);
          std::operator<<(poVar4,'\t');
          local_290 = local_290 / 100.0;
        }
        else {
          *(undefined8 *)((long)auStack_228 + *(long *)(_os + -0x18)) = 8;
          poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar1 + *plVar2 * lVar7 + lVar8 * 8))
          ;
          std::operator<<(poVar4,'\t');
        }
        local_288 = local_288 + local_290;
      }
      *(uint *)((long)auStack_218 + *(long *)(_os + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(_os + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)((long)auStack_228 + *(long *)(_os + -0x18)) = uVar6;
      std::ostream::_M_insert<double>(local_288);
      std::operator<<((ostream *)&os,'\n');
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&os);
  return;
}

Assistant:

void YacclabTests::SaveAverageWithStepsResults(const std::string& os_name, const std::string& dataset_name, bool rounded) {
    std::ofstream os(os_name);
    if (!os.is_open()) {
        dmux::cout << "Unable to save average results" << '\n';
        return;
    }

    // Write heading string in output stream
    os << "#Algorithm" << '\t';
    for (int step_number = 0; step_number != StepType::ST_SIZE; ++step_number) {
        StepType step = static_cast<StepType>(step_number);
        os << Step(step) << '\t';
    }
    os << "Total" << '\n';

    const auto& results = average_ws_results_.at(dataset_name);

    for (int r = 0; r < results.rows; ++r) {
        const auto& algo_name = mode_cfg_.ccl_average_ws_algorithms[r];
        double cumulative_sum{ 0.0 };

        // Gnuplot requires double-escaped name when underscores are encountered
        //{
        //    string algo_name_double_escaped{ algo_name };
        //    std::size_t found = algo_name_double_escaped.find_first_of("_");
        //    while (found != std::string::npos) {
        //        algo_name_double_escaped.insert(found, "\\\\");
        //        found = algo_name_double_escaped.find_first_of("_", found + 3);
        //    }
        //    os << algo_name_double_escaped << '\t';
        //}
        os << DoubleEscapeUnderscore(std::string(algo_name)) << '\t';

        for (int c = 0; c < results.cols; ++c) {
            if (rounded) {
                cumulative_sum += floor(results(r, c) * 100.00 + 0.5) / 100.00;
                os << std::fixed << std::setprecision(2) << results(r, c) << '\t';
            }
            else {
                cumulative_sum += results(r, c);
                os << std::fixed << std::setprecision(8) << results(r, c) << '\t';
            }
        }
        // Write cumulative_sum as total
        if (rounded) {
            os << std::fixed << std::setprecision(2) << cumulative_sum;
        }
        else {
            os << std::fixed << std::setprecision(8) << cumulative_sum;
        }
        os << '\n';
    }
    os.close();
}